

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_buffered_reader.cpp
# Opt level: O2

void __thiscall
HttpdBufferedReader_SomeCharactersThenAnError_Test::TestBody
          (HttpdBufferedReader_SomeCharactersThenAnError_Test *this)

{
  TypedExpectation<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
  *pTVar1;
  _Tuple_impl<0UL,_int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
  *__in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *lhs;
  char *pcVar2;
  type *this_00;
  char *in_R9;
  error_code eVar3;
  int io;
  MatcherBase<int> MStack_1d0;
  AssertionResult gtest_ar_;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void> str1;
  AssertionResult gtest_ar__1;
  MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&> local_150;
  gets_result_type s1;
  _Function_base local_100;
  buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>_>
  br;
  refiller r;
  
  refiller::refiller(&r);
  testing::Matcher<int>::Matcher((Matcher<int> *)&MStack_1d0,0);
  local_150.vtable_ =
       (VTable *)
       testing::internal::MatcherBase<pstore::gsl::span<unsigned_char,-1l>const&>::
       GetVTable<testing::internal::MatcherBase<pstore::gsl::span<unsigned_char,-1l>const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  local_150.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
       (_func_int **)&PTR__MatcherBase_001b1210;
  refiller::gmock_fill
            ((MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
              *)&br,&r,(Matcher<int> *)&MStack_1d0,
             (Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&> *)&local_150);
  testing::internal::GetWithoutMatchers();
  pTVar1 = testing::internal::
           MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
           ::InternalExpectedAt
                     ((MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
                       *)&br,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                      ,0xce,"r","fill (0, _)");
  std::__cxx11::string::string((string *)&gtest_ar__1,"abc\nd",(allocator *)&io);
  yield_string((refiller_function *)&gtest_ar_,(string *)&gtest_ar__1);
  str1.valid_ = false;
  str1._1_7_ = 0;
  str1.storage_.__align = (anon_struct_8_0_00000001_for___align)0x0;
  str1.storage_._8_8_ = 0;
  if ((_Manager_type)local_1a8._M_allocated_capacity != (_Manager_type)0x0) {
    str1.valid_ = gtest_ar_.success_;
    str1._1_7_ = gtest_ar_._1_7_;
    str1.storage_.__align =
         (anon_struct_8_0_00000001_for___align)
         gtest_ar_.message_._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         .
         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
         ._M_head_impl;
    str1.storage_._8_8_ = local_1a8._M_allocated_capacity;
  }
  testing::
  Action<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(int,pstore::gsl::span<unsigned_char,-1l>const&)>
  ::
  Action<std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>,void>
            ((Action<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
              *)&s1,(function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
                     *)&str1);
  testing::internal::
  TypedExpectation<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::WillOnce(pTVar1,(Action<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
                     *)&s1);
  std::_Function_base::~_Function_base((_Function_base *)&s1);
  std::_Function_base::~_Function_base((_Function_base *)&str1);
  std::_Function_base::~_Function_base((_Function_base *)&gtest_ar_);
  std::__cxx11::string::~string((string *)&gtest_ar__1);
  std::
  _Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<const_pstore::gsl::span<unsigned_char,_-1L>_&>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>_>
                  *)((long)&br.refill_.super__Function_base._M_functor + 8));
  testing::internal::MatcherBase<const_pstore::gsl::span<unsigned_char,_-1L>_&>::~MatcherBase
            (&local_150);
  testing::internal::MatcherBase<int>::~MatcherBase(&MStack_1d0);
  testing::Matcher<int>::Matcher((Matcher<int> *)&gtest_ar_,1);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )testing::internal::MatcherBase<pstore::gsl::span<unsigned_char,-1l>const&>::
         GetVTable<testing::internal::MatcherBase<pstore::gsl::span<unsigned_char,-1l>const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
         ::kVTable;
  gtest_ar__1._0_8_ = &PTR__MatcherBase_001b1210;
  refiller::gmock_fill
            ((MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
              *)&br,&r,(Matcher<int> *)&gtest_ar_,
             (Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&> *)&gtest_ar__1);
  testing::internal::GetWithoutMatchers();
  pcVar2 = "r";
  pTVar1 = testing::internal::
           MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
           ::InternalExpectedAt
                     ((MockSpec<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
                       *)&br,
                      "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                      ,0xcf,"r","fill (1, _)");
  s1.field_0.storage_.__align = (anon_struct_8_0_00000001_for___align)0x0;
  s1.field_0._8_8_ = 0;
  str1.valid_ = false;
  str1._1_7_ = 0;
  str1.storage_.__align = (anon_struct_8_0_00000001_for___align)0x0;
  s1.field_0._16_8_ = 0;
  s1.field_0._24_8_ = 0;
  str1.storage_._8_8_ =
       std::
       _Function_handler<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp:207:52)>
       ::_M_manager;
  str1.storage_._16_8_ =
       std::
       _Function_handler<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp:207:52)>
       ::_M_invoke;
  std::_Function_base::~_Function_base((_Function_base *)&s1);
  testing::internal::
  TypedExpectation<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>
  ::WillOnce(pTVar1,(Action<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
                     *)&str1);
  std::_Function_base::~_Function_base((_Function_base *)&str1);
  std::
  _Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<const_pstore::gsl::span<unsigned_char,_-1L>_&>_>
  ::~_Tuple_impl((_Tuple_impl<0UL,_testing::Matcher<int>,_testing::Matcher<const_pstore::gsl::span<unsigned_char,__1L>_&>_>
                  *)((long)&br.refill_.super__Function_base._M_functor + 8));
  testing::internal::MatcherBase<const_pstore::gsl::span<unsigned_char,_-1L>_&>::~MatcherBase
            ((MatcherBase<const_pstore::gsl::span<unsigned_char,__1L>_&> *)&gtest_ar__1);
  testing::internal::MatcherBase<int>::~MatcherBase((MatcherBase<int> *)&gtest_ar_);
  io = 0;
  refiller::refill_function(&r);
  pstore::http::
  make_buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>>
            (&br,(http *)&local_100,
             (function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,__1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,__1L>_&)>
              *)0x1000,(size_t)pcVar2);
  std::_Function_base::~_Function_base(&local_100);
  pstore::http::
  buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(int,pstore::gsl::span<unsigned_char,-1l>const&)>>
  ::gets_abi_cxx11_((buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>>
                     *)&s1,(char *)&br);
  gtest_ar_._0_8_ = CONCAT71(gtest_ar_._1_7_,s1.has_error_) ^ 1;
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  if (s1.has_error_ == false) {
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    str1._0_8_ = str1._0_8_ & 0xffffffffffffff00;
    __in = &pstore::error_or<std::tuple<int,pstore::maybe<std::__cxx11::string,void>>>::
            value_storage_impl<pstore::error_or<std::tuple<int,pstore::maybe<std::__cxx11::string,void>>>const&,std::tuple<int,pstore::maybe<std::__cxx11::string,void>>const>
                      (&s1)->
            super__Tuple_impl<0UL,_int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>
    ;
    gtest_ar_._0_8_ = &str1;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
            )&io;
    std::_Tuple_impl<0ul,int&,pstore::maybe<std::__cxx11::string,void>&>::
    _M_assign<int,pstore::maybe<std::__cxx11::string,void>>
              ((_Tuple_impl<0UL,_int_&,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_&>
                *)&gtest_ar_,__in);
    gtest_ar__1.success_ = str1.valid_;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (str1.valid_ == false) {
      testing::Message::Message((Message *)&MStack_1d0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_,(internal *)&gtest_ar__1,
                 (AssertionResult *)"str1.has_value ()","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_150,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                 ,0xda,(char *)gtest_ar_._0_8_);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_150,(Message *)&MStack_1d0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_150);
      std::__cxx11::string::~string((string *)&gtest_ar_);
      if (MStack_1d0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
          (_func_int **)0x0) {
        (**(code **)(*MStack_1d0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 8
                    ))();
      }
      std::
      unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~unique_ptr(&gtest_ar__1.message_);
      pstore::
      maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
      reset(&str1);
      goto LAB_0011d080;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar__1.message_);
    lhs = pstore::maybe<std::__cxx11::string,void>::
          value_impl<pstore::maybe<std::__cxx11::string,void>&,std::__cxx11::string>(&str1);
    testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
              ((internal *)&gtest_ar_,"str1.value ()","\"abc\"",lhs,(char (*) [4])"abc");
    if (gtest_ar_.success_ == false) {
      testing::Message::Message((Message *)&gtest_ar__1);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl ==
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)gtest_ar_.message_._M_t.
                           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                           ._M_head_impl;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&MStack_1d0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                 ,0xdb,pcVar2);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&MStack_1d0,(Message *)&gtest_ar__1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&MStack_1d0);
      if (gtest_ar__1._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar__1._0_8_ + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    pstore::
    maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>::
    reset(&str1);
    pstore::
    error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
    ::~error_or(&s1);
    pstore::http::
    buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,-1l>,false>>>(int,pstore::gsl::span<unsigned_char,-1l>const&)>>
    ::gets_abi_cxx11_((buffered_reader<int,std::function<pstore::error_or<std::tuple<int,pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_1l>,false>>>(int,pstore::gsl::span<unsigned_char,_1l>const&)>>
                       *)&s1,(char *)&br);
    gtest_ar_.success_ = s1.has_error_;
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )0x0;
    if (s1.has_error_ == false) {
      testing::Message::Message((Message *)&gtest_ar__1);
      std::operator<<((ostream *)(gtest_ar__1._0_8_ + 0x10),"An error was expected");
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&str1,(internal *)&gtest_ar_,(AssertionResult *)"static_cast<bool> (s2)",
                 "true","false",in_R9);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&MStack_1d0,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                 ,0xdf,(char *)str1._0_8_);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&MStack_1d0,(Message *)&gtest_ar__1);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&MStack_1d0);
      std::__cxx11::string::~string((string *)&str1);
      MStack_1d0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
           (_func_int **)gtest_ar__1._0_8_;
      goto LAB_0011cf2c;
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr(&gtest_ar_.message_);
    eVar3 = pstore::
            error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
            ::get_error(&s1);
    gtest_ar_.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )eVar3._M_cat;
    gtest_ar_._0_4_ = eVar3._M_value;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )std::_V2::generic_category();
    gtest_ar__1._0_4_ = 1;
    testing::internal::CmpHelperEQ<std::error_code,std::error_code>
              ((internal *)&str1,"s2.get_error ()",
               "(std::make_error_code (std::errc::operation_not_permitted))",
               (error_code *)&gtest_ar_,(error_code *)&gtest_ar__1);
    if (str1.valid_ == false) {
      testing::Message::Message((Message *)&gtest_ar_);
      if (str1.storage_.__align == (anon_struct_8_0_00000001_for___align)0x0) {
        pcVar2 = "";
      }
      else {
        pcVar2 = *(char **)str1.storage_.__align;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
                 ,0xe0,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1,(Message *)&gtest_ar_)
      ;
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1);
      if (gtest_ar_._0_8_ != 0) {
        (**(code **)(*(long *)gtest_ar_._0_8_ + 8))();
      }
    }
    this_00 = &str1.storage_;
  }
  else {
    testing::Message::Message((Message *)&MStack_1d0);
    std::operator<<((ostream *)
                    (MStack_1d0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 2)
                    ,"Error: ");
    eVar3 = pstore::
            error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
            ::get_error(&s1);
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )eVar3._M_cat;
    gtest_ar__1._0_4_ = eVar3._M_value;
    std::operator<<((basic_ostream<char,_std::char_traits<char>_> *)
                    (MStack_1d0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 2)
                    ,(error_code *)&gtest_ar__1);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&str1,(internal *)&gtest_ar_,(AssertionResult *)"static_cast<bool> (s1)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_150,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/http/test_buffered_reader.cpp"
               ,0xd7,(char *)str1._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_150,(Message *)&MStack_1d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_150);
    std::__cxx11::string::~string((string *)&str1);
LAB_0011cf2c:
    this_00 = (type *)&gtest_ar_.message_;
    if (MStack_1d0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface !=
        (_func_int **)0x0) {
      (**(code **)(*MStack_1d0.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface + 8))
                ();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&this_00->__align);
LAB_0011d080:
  pstore::
  error_or<std::tuple<int,_pstore::maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>_>_>
  ::~error_or(&s1);
  pstore::http::
  buffered_reader<int,_std::function<pstore::error_or<std::tuple<int,_pstore::gsl::details::span_iterator<pstore::gsl::span<unsigned_char,_-1L>,_false>_>_>_(int,_const_pstore::gsl::span<unsigned_char,_-1L>_&)>_>
  ::~buffered_reader(&br);
  refiller::~refiller(&r);
  return;
}

Assistant:

TEST (HttpdBufferedReader, SomeCharactersThenAnError) {
    refiller r;
    EXPECT_CALL (r, fill (0, _)).WillOnce (Invoke (yield_string ("abc\nd")));
    EXPECT_CALL (r, fill (1, _)).WillOnce (Invoke ([] (int, span<std::uint8_t> const &) {
        return refiller_result_type (std::make_error_code (std::errc::operation_not_permitted));
    }));

    auto io = 0;
    auto br = make_buffered_reader<int> (r.refill_function ());
    {
        gets_result_type const s1 = br.gets (io);
        ASSERT_TRUE (static_cast<bool> (s1)) << "Error: " << s1.get_error ();
        maybe<std::string> str1;
        std::tie (io, str1) = *s1;
        ASSERT_TRUE (str1.has_value ());
        EXPECT_EQ (str1.value (), "abc");
    }
    {
        gets_result_type const s2 = br.gets (io);
        ASSERT_FALSE (static_cast<bool> (s2)) << "An error was expected";
        EXPECT_EQ (s2.get_error (), (std::make_error_code (std::errc::operation_not_permitted)));
    }
}